

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O0

VkResult __thiscall
VulkanUtilities::VulkanLogicalDevice::ResetCommandPool
          (VulkanLogicalDevice *this,VkCommandPool vkCmdPool,VkCommandPoolResetFlags flags)

{
  Char *Message;
  undefined1 local_40 [8];
  string msg;
  VkResult err;
  VkCommandPoolResetFlags flags_local;
  VkCommandPool vkCmdPool_local;
  VulkanLogicalDevice *this_local;
  
  msg.field_2._12_4_ = flags;
  msg.field_2._8_4_ = (*vkResetCommandPool)(this->m_VkDevice,vkCmdPool,flags);
  if (msg.field_2._8_4_ != VK_SUCCESS) {
    Diligent::FormatString<char[29]>
              ((string *)local_40,(char (*) [29])"Failed to reset command pool");
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"ResetCommandPool",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x2c2);
    std::__cxx11::string::~string((string *)local_40);
  }
  return msg.field_2._8_4_;
}

Assistant:

VkResult VulkanLogicalDevice::ResetCommandPool(VkCommandPool           vkCmdPool,
                                               VkCommandPoolResetFlags flags) const
{
    VkResult err = vkResetCommandPool(m_VkDevice, vkCmdPool, flags);
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to reset command pool");
    return err;
}